

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O3

int __thiscall H264StreamReader::processSPS(H264StreamReader *this,uint8_t *buff)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  uint uVar3;
  SPSUnit *this_00;
  _Rb_tree_color _Var4;
  int iVar5;
  SPSUnit *this_01;
  uint8_t *puVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  mapped_type *ppSVar9;
  bool bVar10;
  _Base_ptr p_Var11;
  uint *__v;
  bool bVar12;
  double sar;
  string local_50;
  
  if (this->m_needSeiCorrection == true) {
    puVar6 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
    if ((long)puVar6 - (long)buff < 8) {
      return -10;
    }
    _Var4 = NALUnit::extractUEGolombCode(buff + 4,puVar6);
    p_Var7 = (this->updatedSPSList)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var7 != (_Base_ptr)0x0) {
      p_Var1 = &(this->updatedSPSList)._M_t._M_impl.super__Rb_tree_header;
      p_Var11 = &p_Var1->_M_header;
      do {
        bVar12 = p_Var7[1]._M_color < _Var4;
        if (!bVar12) {
          p_Var11 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[bVar12];
      } while (p_Var7 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var11 != p_Var1) && (p_Var11[1]._M_color <= _Var4)) {
        return 0;
      }
    }
  }
  this_01 = (SPSUnit *)operator_new(0x200);
  SPSUnit::SPSUnit(this_01);
  puVar6 = NALUnit::findNALWithStartCode
                     (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,true);
  NALUnit::decodeBuffer((NALUnit *)this_01,buff,puVar6);
  iVar5 = SPSUnit::deserialize(this_01);
  bVar12 = (this_01->nalHrdParams).isPresent;
  if (this->orig_hrd_parameters_present_flag == bVar12) {
    bVar10 = (this_01->vclHrdParams).isPresent;
    if (this->orig_vcl_parameters_present_flag != bVar10) goto LAB_0018628a;
  }
  else {
    bVar10 = (this_01->vclHrdParams).isPresent;
LAB_0018628a:
    this->orig_hrd_parameters_present_flag = bVar12;
    this->orig_vcl_parameters_present_flag = bVar10;
    if (this->m_spsChangeWarned == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "H264 warn: SPS parameters is not consistent throughout a stream",0x3f);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      sLastMsg = true;
      this->m_spsChangeWarned = true;
    }
  }
  if (iVar5 != 0) {
    SPSUnit::~SPSUnit(this_01);
    operator_delete(this_01,0x200);
    return iVar5;
  }
  __v = &this_01->seq_parameter_set_id;
  p_Var7 = (this->m_spsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_spsMap)._M_t._M_impl.super__Rb_tree_header;
    _Var4 = *__v;
    p_Var11 = &p_Var1->_M_header;
    do {
      bVar12 = p_Var7[1]._M_color < _Var4;
      if (!bVar12) {
        p_Var11 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[bVar12];
    } while (p_Var7 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var11 != p_Var1) && (p_Var11[1]._M_color <= _Var4)) goto LAB_001864b7;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Decoding H264 stream (track ",0x1c);
  poVar8 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      (this->super_MPEGStreamReader).super_AbstractStreamReader.m_streamIndex);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"): ",3);
  SPSUnit::getStreamDescr_abi_cxx11_(&local_50,this_01);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  sLastMsg = true;
  if (this->m_forcedLevel != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Change H264 level from ",0x17);
    poVar8 = std::ostream::_M_insert<double>((double)this_01->level_idc / 10.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," to ",4);
    poVar8 = std::ostream::_M_insert<double>((double)this->m_forcedLevel / 10.0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    sLastMsg = true;
  }
LAB_001864b7:
  if ((this->m_forcedLevel != '\0') &&
     (3 < (long)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd - (long)buff)) {
    buff[3] = this->m_forcedLevel;
    bVar2 = this->m_forcedLevel;
    (this_01->super_NALUnit).m_nalBuffer[3] = bVar2;
    this_01->level_idc = (uint)bVar2;
  }
  MPEGStreamReader::updateFPS
            (&this->super_MPEGStreamReader,this_01,buff,puVar6,(int)puVar6 - (int)buff);
  updateHRDParam(this,this_01);
  if ((this_01->nalHrdParams).isPresent == true) {
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&this->updatedSPSList,__v);
  }
  ppSVar9 = std::
            map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
            ::operator[](&this->m_spsMap,__v);
  this_00 = *ppSVar9;
  if (this_00 != (SPSUnit *)0x0) {
    SPSUnit::~SPSUnit(this_00);
  }
  operator_delete(this_00,0x200);
  ppSVar9 = std::
            map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
            ::operator[](&this->m_spsMap,__v);
  *ppSVar9 = this_01;
  sar = 1.0;
  if (this_01->aspect_ratio_info_present_flag != 0) {
    bVar2 = this_01->aspect_ratio_idc;
    if ((byte)(bVar2 - 1) < 0x10) {
      sar = h264_ar_coeff[bVar2];
    }
    else if (bVar2 == 0xff) {
      uVar3._0_2_ = this_01->sar_width;
      uVar3._2_2_ = this_01->sar_height;
      sar = (double)(uVar3 & 0xffff) / (double)(uVar3 >> 0x10);
    }
  }
  MPEGStreamReader::fillAspectBySAR(&this->super_MPEGStreamReader,sar);
  return 0;
}

Assistant:

int H264StreamReader::processSPS(uint8_t *buff)
{
    if (replaceToOwnSPS())
    {
        // do not updat SPS in stream because of we are going to insert own sps
        if (m_bufEnd - buff < 8)
            return NOT_ENOUGH_BUFFER;
        const int seq_parameter_set_id = static_cast<int>(NALUnit::extractUEGolombCode(buff + 4, m_bufEnd));
        if (updatedSPSList.find(seq_parameter_set_id) != updatedSPSList.end())
            return 0;  // already processed
    }

    auto *sps = new SPSUnit();
    uint8_t *nextNal = NALUnit::findNALWithStartCode(buff, m_bufEnd, true);
    const int oldSpsLen = static_cast<int>(nextNal - buff);
    sps->decodeBuffer(buff, nextNal);
    const int nalRez = sps->deserialize();

    if (orig_hrd_parameters_present_flag != sps->nalHrdParams.isPresent ||
        orig_vcl_parameters_present_flag != sps->vclHrdParams.isPresent)
    {
        orig_hrd_parameters_present_flag = sps->nalHrdParams.isPresent;
        orig_vcl_parameters_present_flag = sps->vclHrdParams.isPresent;
        if (!m_spsChangeWarned)
        {
            LTRACE(LT_WARN, 2, "H264 warn: SPS parameters is not consistent throughout a stream");
            m_spsChangeWarned = true;
        }
    }

    // long sps fields can cause 00 00 0x code and it is required decode slice header
    if (nalRez != 0)
    {
        delete sps;
        return nalRez;  // not enough buffer
    }

    if (m_spsMap.find(sps->seq_parameter_set_id) == m_spsMap.end())
    {
        LTRACE(LT_INFO, 2, "Decoding H264 stream (track " << m_streamIndex << "): " << sps->getStreamDescr());
        if (m_forcedLevel != 0)
            LTRACE(LT_INFO, 2, "Change H264 level from " << sps->level_idc / 10.0 << " to " << m_forcedLevel / 10.0);
    }
    // update profile if needed
    if (m_forcedLevel != 0 && m_bufEnd - buff >= 4)
    {
        buff[3] = m_forcedLevel;
        sps->m_nalBuffer[3] = m_forcedLevel;
        sps->level_idc = m_forcedLevel;
    }

    updateFPS(sps, buff, nextNal, oldSpsLen);
    updateHRDParam(sps);
    if (sps->nalHrdParams.isPresent)
        updatedSPSList.insert(sps->seq_parameter_set_id);

    delete m_spsMap[sps->seq_parameter_set_id];
    m_spsMap[sps->seq_parameter_set_id] = sps;

    double sarAR = 1.0;
    if (sps->aspect_ratio_info_present_flag)
    {
        if (sps->aspect_ratio_idc >= 1 && sps->aspect_ratio_idc <= 16)
            sarAR = h264_ar_coeff[sps->aspect_ratio_idc];
        else if (sps->aspect_ratio_idc == Extended_SAR)
            sarAR = sps->sar_width / static_cast<double>(sps->sar_height);
    }
    fillAspectBySAR(sarAR);

    return 0;
}